

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allmain.c
# Opt level: O2

void newgame(void)

{
  undefined1 *puVar1;
  monst *mtmp;
  unsigned_short *puVar2;
  obj *poVar3;
  long lVar4;
  int msgnum;
  
  flags.ident = 1;
  puVar2 = &mons[0].geno;
  for (lVar4 = 2; lVar4 != 0x4bb; lVar4 = lVar4 + 3) {
    (&mvitals[0].born)[lVar4] = (byte)*puVar2 & 0x10;
    puVar2 = puVar2 + 0x20;
  }
  init_objects();
  flags.pantheon = -1;
  role_init();
  init_dungeons();
  init_artifacts();
  u_init();
  load_qtlist();
  level = mklev(&u.uz);
  u_init_inv_skills();
  u_on_upstairs();
  vision_reset();
  check_special_room('\0');
  iflags.botl = '\x01';
  mtmp = level->monsters[u.ux][u.uy];
  if ((mtmp != (monst *)0x0) && ((mtmp->field_0x61 & 2) == 0)) {
    mnexto(mtmp);
  }
  makedog();
  doredraw();
  if (urole.malenum == 0x15d) {
    poVar3 = mkobj(level,'\x10','\x01');
    setworn(poVar3,0x400000);
    poVar3 = mkobj(level,'\x0f','\x01');
    setworn(poVar3,0x200000);
    uball->spe = '\x01';
    placebc();
  }
  notify_levelchange((d_level *)0x0);
  if (flags.legacy != '\0') {
    flush_screen();
    msgnum = 1;
    if (urole.malenum == 0x15d) {
      msgnum = 199;
    }
    com_pager(msgnum);
  }
  puVar1 = &level->locations[u.ux][u.uy].field_0x6;
  *(uint *)puVar1 = *(uint *)puVar1 | 4;
  program_state.something_worth_saving = program_state.something_worth_saving + 1;
  historic_event('\0',"entered the Dungeons of Doom to retrieve the Amulet of Yendor!");
  welcome('\x01');
  maybe_tutorial();
  flags.move = '\0';
  set_wear();
  pickup(1);
  log_command_result();
  program_state.game_running = 1;
  youmonst.movement = 0xc;
  realtime_tasks();
  post_init_tasks();
  return;
}

Assistant:

static void newgame(void)
{
    int i;

    flags.ident = 1;

    for (i = 0; i < NUMMONS; i++)
	    mvitals[i].mvflags = mons[i].geno & G_NOCORPSE;

    init_objects();	/* must be before u_init() */

    flags.pantheon = -1;/* role_init() will reset this */
    role_init();	/* must be before init_dungeons(), u_init(),
			 * and init_artifacts() */

    init_dungeons();	/* must be before u_init() to avoid rndmonst()
			 * creating odd monsters for any tins and eggs
			 * in hero's initial inventory */
    init_artifacts();
    u_init();		/* struct you must have some basic data for mklev to work right */

    load_qtlist();	/* load up the quest text info */

    level = mklev(&u.uz);

    u_init_inv_skills();/* level must be valid to create items */
    u_on_upstairs();
    vision_reset();	/* set up internals for level (after mklev) */
    check_special_room(FALSE);

    iflags.botl = 1;

    /* Move the monster from under you or else
     * makedog() will fail when it calls makemon().
     *			- ucsfcgl!kneller
     */
    if (MON_AT(level, u.ux, u.uy)) mnexto(m_at(level, u.ux, u.uy));
    makedog();
    doredraw();

    if (Role_if(PM_CONVICT)) {
	setworn(mkobj(level, CHAIN_CLASS, TRUE), W_CHAIN);
	setworn(mkobj(level, BALL_CLASS, TRUE), W_BALL);
	uball->spe = 1;	/* attach the ball to the hero */
	placebc();
    }

    /* help the window port get it's display charset/tiles sorted out */
    notify_levelchange(NULL);

    if (flags.legacy) {
	    flush_screen();
	    com_pager(Role_if(PM_CONVICT) ? 199 : 1);
    }

    /* Stop autoexplore revisiting the entrance stairs (or position). */
    level->locations[u.ux][u.uy].mem_stepped = 1;

    program_state.something_worth_saving++;	/* useful data now exists */
    
    historic_event(FALSE, "entered the Dungeons of Doom to retrieve the Amulet of Yendor!");

    /* Success! */
    welcome(TRUE);
    maybe_tutorial();

    /* Prepare for the first move. */
    flags.move = 0;
    set_wear();
    pickup(1);

    log_command_result();

    program_state.game_running = TRUE;
    youmonst.movement = NORMAL_SPEED;	/* give the hero some movement points */
    realtime_tasks();
    post_init_tasks();

    return;
}